

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.hpp
# Opt level: O0

void __thiscall Callable::~Callable(Callable *this)

{
  Callable *this_local;
  
  std::function<void_(Peer_*)>::~function(&this->one_);
  std::function<void_()>::~function(&this->zero_);
  return;
}

Assistant:

Callable(std::function<void()> f) : zero_(f) {}